

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpp_cluster.cpp
# Opt level: O3

void * cluster_worker(void *data)

{
  MppMutexCond *__mutex;
  list_head *plVar1;
  uint *puVar2;
  uint uVar3;
  MppThread *this;
  list_head *plVar4;
  list_head *plVar5;
  list_head *plVar6;
  ClusterQueue *queue;
  MppThreadStatus MVar7;
  RK_S32 RVar8;
  undefined4 uVar9;
  uint uVar10;
  int iVar11;
  RK_S64 RVar12;
  RK_S64 RVar13;
  MppNodeTask *task;
  list_head *plVar14;
  bool bVar15;
  
  this = *(MppThread **)((long)data + 0x30);
  __mutex = this->mMutexCond;
  plVar1 = (list_head *)((long)data + 0x48);
  while( true ) {
    if ((mpp_cluster_debug & 2) != 0) {
      _mpp_log_l(4,"mpp_cluster","%s lock start\n",(char *)0x0,data);
    }
    pthread_mutex_lock((pthread_mutex_t *)__mutex);
    if ((mpp_cluster_debug & 2) != 0) {
      _mpp_log_l(4,"mpp_cluster","%s lock done\n",(char *)0x0,data);
    }
    MVar7 = MppThread::get_status(this,THREAD_WORK);
    if (MVar7 != MPP_THREAD_RUNNING) {
      pthread_mutex_unlock((pthread_mutex_t *)__mutex);
      return (void *)0x0;
    }
    RVar8 = cluster_worker_get_task((ClusterWorker *)data);
    if (RVar8 == 0) {
      *(undefined4 *)((long)data + 0x38) = 0;
      MVar7 = this->mStatus[0];
      this->mStatus[0] = MPP_THREAD_WAITING;
      pthread_cond_wait((pthread_cond_t *)&this->mMutexCond[0].mCondition,(pthread_mutex_t *)__mutex
                       );
      if (this->mStatus[0] == MPP_THREAD_WAITING) {
        this->mStatus[0] = MVar7;
      }
      *(undefined4 *)((long)data + 0x38) = 1;
    }
    pthread_mutex_unlock((pthread_mutex_t *)__mutex);
    if ((mpp_cluster_debug & 1) != 0) {
      _mpp_log_l(4,"mpp_cluster","%s run %d work start\n",(char *)0x0,data,
                 (ulong)*(uint *)((long)data + 0x40));
    }
    plVar14 = plVar1->next;
    if (plVar14 == plVar1) {
      iVar11 = *(int *)((long)data + 0x40);
    }
    else {
      do {
        plVar4 = plVar14[1].next;
        plVar5 = plVar14[2].prev;
        if ((mpp_cluster_debug & 1) != 0) {
          _mpp_log_l(4,"mpp_cluster","%s run %s start atate %d\n",(char *)0x0,data,plVar14[1].prev,
                     *(undefined4 *)((long)&plVar4[2].next + 4));
        }
        uVar3 = *(uint *)((long)&plVar4[2].next + 4);
        if ((uVar3 & 0x10) == 0) {
          _mpp_log_l(2,"mpp_cluster","Assertion %s failed at %s:%d\n",(char *)0x0,
                     "node->state & (0x00000010)","cluster_worker_run_task",0x1df);
          if ((mpp_debug._3_1_ & 0x10) != 0) goto LAB_00156c56;
          uVar3 = *(uint *)((long)&plVar4[2].next + 4);
        }
        if ((uVar3 & 0x10) == 0) {
          _mpp_log_l(2,"mpp_cluster","%s run state check %x is invalid on run",
                     "cluster_worker_run_task",data);
        }
        RVar12 = mpp_time();
        uVar9 = (*(code *)plVar5->next)(plVar5->prev);
        RVar13 = mpp_time();
        if ((mpp_cluster_debug & 1) != 0) {
          _mpp_log_l(4,"mpp_cluster","%s run %s ret %d\n",(char *)0x0,data,plVar14[1].prev,uVar9);
        }
        plVar5[1].prev = (list_head *)((long)plVar5[1].prev + (RVar13 - RVar12));
        *(int *)&plVar5[1].next = *(int *)&plVar5[1].next + 1;
        uVar3 = *(uint *)((long)&plVar4[2].next + 4);
        if ((uVar3 & 1) == 0) {
          if ((mpp_cluster_debug & 1) != 0) {
            _mpp_log_l(4,"mpp_cluster","%s run found destroy\n",(char *)0x0,data);
          }
          plVar5 = plVar14->next;
          plVar6 = plVar14->prev;
          plVar5->prev = plVar6;
          plVar6->next = plVar5;
          plVar14->next = plVar14;
          plVar14->prev = plVar14;
          *(undefined4 *)((long)&plVar4[4].prev + 4) = 0;
          sem_post((sem_t *)(plVar4 + 5));
          if ((mpp_cluster_debug & 1) != 0) {
            _mpp_log_l(4,"mpp_cluster","%s run sem post done\n",(char *)0x0,data);
          }
        }
        else if ((uVar3 & 4) == 0) {
          plVar5 = plVar14->next;
          plVar6 = plVar14->prev;
          plVar5->prev = plVar6;
          plVar6->next = plVar5;
          plVar14->next = plVar14;
          plVar14->prev = plVar14;
          do {
            uVar3 = *(uint *)((long)&plVar4[2].next + 4);
            puVar2 = (uint *)((long)&plVar4[2].next + 4);
            LOCK();
            bVar15 = uVar3 == *puVar2;
            if (bVar15) {
              *puVar2 = uVar3 ^ 0x12;
            }
            UNLOCK();
          } while (!bVar15);
          uVar10 = *(uint *)((long)&plVar4[2].next + 4);
          if ((uVar10 & 2) == 0) {
            _mpp_log_l(2,"mpp_cluster","Assertion %s failed at %s:%d\n",(char *)0x0,
                       "node->state & (0x00000002)","cluster_worker_run_task",0x20d);
            if ((mpp_debug._3_1_ & 0x10) != 0) goto LAB_00156c56;
            uVar10 = *(uint *)((long)&plVar4[2].next + 4);
          }
          if (((uVar10 & 0x10) != 0) &&
             (_mpp_log_l(2,"mpp_cluster","Assertion %s failed at %s:%d\n",(char *)0x0,
                         "!(node->state & (0x00000010))","cluster_worker_run_task",0x20e),
             (mpp_debug._3_1_ & 0x10) != 0)) goto LAB_00156c56;
          if ((mpp_cluster_debug & 1) != 0) {
            _mpp_log_l(4,"mpp_cluster","%s run state %x -> %x run -> idle\n",(char *)0x0,data,
                       (ulong)uVar3,uVar3 ^ 0x12);
          }
        }
        else {
          queue = (ClusterQueue *)plVar14[2].next;
          plVar5 = plVar14->next;
          plVar6 = plVar14->prev;
          plVar5->prev = plVar6;
          plVar6->next = plVar5;
          plVar14->next = plVar14;
          plVar14->prev = plVar14;
          do {
            puVar2 = (uint *)((long)&plVar4[2].next + 4);
            LOCK();
            bVar15 = uVar3 == *puVar2;
            if (bVar15) {
              *puVar2 = uVar3 ^ 0x1c;
            }
            UNLOCK();
          } while (!bVar15);
          if ((mpp_cluster_debug & 1) != 0) {
            _mpp_log_l(4,"mpp_cluster","%s run state %x -> %x signal -> wait\n",(char *)0x0,data,
                       (ulong)uVar3,uVar3 ^ 0x1c);
          }
          cluster_queue_lock_f("cluster_worker_run_task",queue);
          plVar4 = (queue->list).prev;
          (queue->list).prev = plVar14;
          plVar14->next = &queue->list;
          plVar14->prev = plVar4;
          plVar4->next = plVar14;
          queue->count = queue->count + 1;
          cluster_queue_unlock_f("cluster_worker_run_task",queue);
        }
        iVar11 = *(int *)((long)data + 0x40) + -1;
        *(int *)((long)data + 0x40) = iVar11;
        plVar14 = *(list_head **)((long)data + 0x48);
      } while (plVar14 != plVar1);
    }
    if ((iVar11 != 0) &&
       (_mpp_log_l(2,"mpp_cluster","Assertion %s failed at %s:%d\n",(char *)0x0,"p->work_count == 0"
                   ,"cluster_worker_run_task",0x216), (mpp_debug._3_1_ & 0x10) != 0)) break;
    if ((mpp_cluster_debug & 1) != 0) {
      _mpp_log_l(4,"mpp_cluster","%s run all done\n",(char *)0x0,data);
    }
  }
LAB_00156c56:
  abort();
}

Assistant:

static void *cluster_worker(void *data)
{
    ClusterWorker *p = (ClusterWorker *)data;
    MppThread *thd = p->thd;

    while (1) {
        {
            RK_S32 task_count = 0;

            cluster_dbg_lock("%s lock start\n", p->name);
            AutoMutex autolock(thd->mutex());
            cluster_dbg_lock("%s lock done\n", p->name);

            if (MPP_THREAD_RUNNING != thd->get_status())
                break;

            task_count = cluster_worker_get_task(p);
            if (!task_count) {
                p->state = WORKER_IDLE;
                thd->wait();
                p->state = WORKER_RUNNING;
            }
        }

        cluster_worker_run_task(p);
    }

    return NULL;
}